

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSinh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSinh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
     *this,int i)

{
  FadExpr<FadFuncSinh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *in_RDI;
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  value_type vVar4;
  int in_stack_ffffffffffffffcc;
  
  vVar1 = FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
          ::dx((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                *)in_RDI,in_stack_ffffffffffffffcc);
  vVar2 = FadExpr<FadFuncSinh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::val
                    ((FadExpr<FadFuncSinh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                     0x1efc8e7);
  vVar3 = FadExpr<FadFuncSinh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::dx
                    (in_RDI,in_stack_ffffffffffffffcc);
  vVar4 = FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
          ::val((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                 *)0x1efc912);
  return vVar1 * vVar2 + vVar3 * vVar4;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}